

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

Aig_Obj_t *
Dar_Balance_rec(Aig_Man_t *pNew,Aig_Obj_t *pObjOld,Vec_Vec_t *vStore,int Level,int fUpdateLevel)

{
  uint uVar1;
  Vec_Ptr_t *vSuper;
  Aig_Obj_t *pAVar2;
  abctime aVar3;
  long lVar4;
  
  if (((ulong)pObjOld & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObjOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                  ,0x1fb,
                  "Aig_Obj_t *Dar_Balance_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Vec_t *, int, int)");
  }
  uVar1 = (uint)*(undefined8 *)&pObjOld->field_0x18;
  if ((uVar1 & 7) == 4) {
    __assert_fail("!Aig_ObjIsBuf(pObjOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                  ,0x1fc,
                  "Aig_Obj_t *Dar_Balance_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Vec_t *, int, int)");
  }
  pAVar2 = (Aig_Obj_t *)(pObjOld->field_5).pData;
  if (pAVar2 == (Aig_Obj_t *)0x0) {
    if ((uVar1 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObjOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                    ,0x200,
                    "Aig_Obj_t *Dar_Balance_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Vec_t *, int, int)");
    }
    vSuper = Dar_BalanceCone(pObjOld,vStore,Level);
    if (vSuper->nSize == 0) {
      pAVar2 = (Aig_Obj_t *)((ulong)pNew->pConst1 ^ 1);
    }
    else {
      if (0 < vSuper->nSize) {
        lVar4 = 0;
        do {
          pAVar2 = Dar_Balance_rec(pNew,(Aig_Obj_t *)
                                        ((ulong)vSuper->pArray[lVar4] & 0xfffffffffffffffe),vStore,
                                   Level + 1,fUpdateLevel);
          if (pAVar2 == (Aig_Obj_t *)0x0) {
            return (Aig_Obj_t *)0x0;
          }
          vSuper->pArray[lVar4] = (void *)((ulong)((uint)vSuper->pArray[lVar4] & 1) ^ (ulong)pAVar2)
          ;
          lVar4 = lVar4 + 1;
        } while (lVar4 < vSuper->nSize);
        if (vSuper->nSize == 1) {
          return (Aig_Obj_t *)*vSuper->pArray;
        }
      }
      pAVar2 = Dar_BalanceBuildSuper
                         (pNew,vSuper,*(Aig_Type_t *)&pObjOld->field_0x18 & AIG_OBJ_VOID,
                          fUpdateLevel);
      if (((pNew->Time2Quit != 0) &&
          (*(char *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24) == '\0')) &&
         (aVar3 = Abc_Clock(), pNew->Time2Quit < aVar3)) {
        return (Aig_Obj_t *)0x0;
      }
      if ((pObjOld->field_5).pData != (void *)0x0) {
        __assert_fail("pObjOld->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                      ,0x21b,
                      "Aig_Obj_t *Dar_Balance_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Vec_t *, int, int)")
        ;
      }
    }
    (pObjOld->field_5).pData = pAVar2;
  }
  return pAVar2;
}

Assistant:

Aig_Obj_t * Dar_Balance_rec( Aig_Man_t * pNew, Aig_Obj_t * pObjOld, Vec_Vec_t * vStore, int Level, int fUpdateLevel )
{
    Aig_Obj_t * pObjNew;
    Vec_Ptr_t * vSuper;
    int i;
    assert( !Aig_IsComplement(pObjOld) );
    assert( !Aig_ObjIsBuf(pObjOld) );
    // return if the result is known
    if ( pObjOld->pData )
        return (Aig_Obj_t *)pObjOld->pData;
    assert( Aig_ObjIsNode(pObjOld) );
    // get the implication supergate
    vSuper = Dar_BalanceCone( pObjOld, vStore, Level );
    // check if supergate contains two nodes in the opposite polarity
    if ( vSuper->nSize == 0 )
        return (Aig_Obj_t *)(pObjOld->pData = Aig_ManConst0(pNew));
    // for each old node, derive the new well-balanced node
    for ( i = 0; i < Vec_PtrSize(vSuper); i++ )
    {
        pObjNew = Dar_Balance_rec( pNew, Aig_Regular((Aig_Obj_t *)vSuper->pArray[i]), vStore, Level + 1, fUpdateLevel );
        if ( pObjNew == NULL )
            return NULL;
        vSuper->pArray[i] = Aig_NotCond( pObjNew, Aig_IsComplement((Aig_Obj_t *)vSuper->pArray[i]) );
    }
    // check for exactly one node
    if ( vSuper->nSize == 1 )
        return (Aig_Obj_t *)Vec_PtrEntry(vSuper, 0);
    // build the supergate
#ifdef USE_LUTSIZE_BALANCE
    pObjNew = Dar_BalanceBuildSuperTop( pNew, vSuper, Aig_ObjType(pObjOld), fUpdateLevel, 6 );
#else
    pObjNew = Dar_BalanceBuildSuper( pNew, vSuper, Aig_ObjType(pObjOld), fUpdateLevel );
#endif
    if ( pNew->Time2Quit && !(Aig_Regular(pObjNew)->Id & 255) && Abc_Clock() > pNew->Time2Quit )
        return NULL;
    // make sure the balanced node is not assigned
//    assert( pObjOld->Level >= Aig_Regular(pObjNew)->Level );
    assert( pObjOld->pData == NULL );
    return (Aig_Obj_t *)(pObjOld->pData = pObjNew);
}